

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

int __thiscall
EdgeParameter::verify
          (EdgeParameter *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  undefined8 uVar1;
  imageException *unaff_retaddr;
  
  if (this->groupFactor == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(unaff_retaddr,(char *)this);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  if (this->skipFactor == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(unaff_retaddr,(char *)this);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  if (this->minimumContrast == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(unaff_retaddr,(char *)this);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  return (uint)this->minimumContrast;
}

Assistant:

void EdgeParameter::verify() const
{
    if ( groupFactor == 0u )
        throw imageException( "Grouping factor for edge detection cannot be 0" );
    if ( skipFactor == 0u )
        throw imageException( "Skip factor for edge detection cannot be 0" );
    if ( minimumContrast == 0u )
        throw imageException( "Minimum contrast for edge detection cannot be 0" );
}